

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagsValidator_InvalidFlagViaSetDefault::Run(void)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  FlagSaver FStack_38;
  string local_30;
  
  FlagSaver::FlagSaver(&FStack_38);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator","InvalidFlagViaSetDefault");
  bVar1 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  _GLOBAL__N_1::Test_FlagsValidator_InvalidFlagViaSetDefault::Run
            ((Test_FlagsValidator_InvalidFlagViaSetDefault *)(ulong)bVar1);
  SetCommandLineOptionWithMode_abi_cxx11_(&local_30,(gflags *)0x1512be,"50",(char *)0x1,in_R8D);
  iVar2 = std::__cxx11::string::compare((char *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (iVar2 == 0) {
    if ((anonymous_namespace)::fLI::FLAGS_test_flag == -1) {
      bVar1 = RegisterFlagValidator
                        (&(anonymous_namespace)::fLI::FLAGS_test_flag,
                         (_func_bool_char_ptr_int32 *)0x0);
      if (bVar1) {
        FlagSaver::~FlagSaver(&FStack_38);
        return;
      }
      goto LAB_0013ac70;
    }
  }
  else {
    _GLOBAL__N_1::Test_FlagsValidator_InvalidFlagViaSetDefault::Run();
  }
  _GLOBAL__N_1::Test_FlagsValidator_InvalidFlagViaSetDefault::Run();
LAB_0013ac70:
  _GLOBAL__N_1::Test_FlagsValidator_InvalidFlagViaSetDefault::Run();
  FlagSaver::~FlagSaver(&FStack_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagsValidator, InvalidFlagViaSetDefault) {
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  // SetCommandLineOptionWithMode returns the empty string on error.
  EXPECT_EQ("", SetCommandLineOptionWithMode("test_flag", "50",
                                             SET_FLAG_IF_DEFAULT));
  EXPECT_EQ(-1, FLAGS_test_flag);   // the setting-to-50 should have failed
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
}